

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.cpp
# Opt level: O1

void goodform::json::serialize(any *v,ostream *output)

{
  bool bVar1;
  bool *pbVar2;
  double *pdVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *input;
  ulong uVar4;
  char *pcVar5;
  
  bVar1 = is<decltype(nullptr)>(v);
  if (bVar1) {
    pcVar5 = "null";
    uVar4 = 4;
  }
  else {
    bVar1 = is<bool>(v);
    if (!bVar1) {
      bVar1 = is<long>(v);
      if (bVar1) {
        get<long>(v);
        std::ostream::_M_insert<long>((long)output);
        return;
      }
      bVar1 = is<unsigned_long>(v);
      if (bVar1) {
        get<unsigned_long>(v);
        std::ostream::_M_insert<unsigned_long>((ulong)output);
        return;
      }
      bVar1 = is<double>(v);
      if (bVar1) {
        pdVar3 = get<double>(v);
        std::ostream::_M_insert<double>(*pdVar3);
        return;
      }
      bVar1 = is<std::__cxx11::string>(v);
      if (bVar1) {
        input = get<std::__cxx11::string>(v);
        write_string(input,output);
        return;
      }
      bVar1 = is<std::vector<std::any,std::allocator<std::any>>>(v);
      if (bVar1) {
        stringify_array(v,output);
        return;
      }
      bVar1 = is<std::map<std::__cxx11::string,std::any,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::any>>>>
                        (v);
      if (bVar1) {
        stringify_object(v,output);
        return;
      }
      return;
    }
    pbVar2 = get<bool>(v);
    pcVar5 = "false";
    if ((ulong)*pbVar2 != 0) {
      pcVar5 = "true";
    }
    uVar4 = (ulong)*pbVar2 ^ 5;
  }
  std::__ostream_insert<char,std::char_traits<char>>(output,pcVar5,uVar4);
  return;
}

Assistant:

void json::serialize(const any& v, std::ostream& output)
  {
    if (is<std::nullptr_t>(v))
    {
      output << "null";
    }
    else if (is<bool>(v))
    {
      output << (get<bool>(v) ? "true":"false");
    }
    else if (is<std::int64_t>(v)) output << get<std::int64_t>(v);
    else if (is<std::uint64_t>(v)) output << get<std::uint64_t>(v);
    else if (is<double>(v)) output << get<double>(v);
    else if (is<std::string>(v))
    {
      write_string(get<std::string>(v), output);
    }
    else if (is<goodform::array_t>(v))
    {
      stringify_array(v, output);
    }
    else if (is<goodform::object_t>(v))
    {
      stringify_object(v, output);
    }
  }